

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseAssertScriptModuleCommand<wabt::AssertModuleCommand<(wabt::CommandType)6>>
          (WastParser *this,TokenType token_type,CommandPtr *out_command)

{
  Result RVar1;
  Command *pCVar2;
  _func_int **pp_Var3;
  Enum EVar4;
  Command *pCVar5;
  
  RVar1 = Expect(this,Lpar);
  EVar4 = Error;
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  RVar1 = Expect(this,token_type);
  if (RVar1.enum_ != Error) {
    pCVar2 = (Command *)operator_new(0x38);
    pCVar2->_vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar2->type = 0;
    pCVar2[1]._vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar2[1].type = 0;
    pCVar2[2]._vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar2[2].type = 0;
    pCVar2[3]._vptr_Command = (_func_int **)0x0;
    pCVar2->type = AssertUnlinkable;
    pCVar2->_vptr_Command = (_func_int **)&PTR__AssertModuleCommand_00243470;
    *(CommandType **)&pCVar2[1].type = &pCVar2[2].type;
    RVar1 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                    *)(pCVar2 + 1));
    if (((RVar1.enum_ == Error) ||
        (RVar1 = ParseQuotedText(this,(string *)&pCVar2[1].type,true), RVar1.enum_ == Error)) ||
       (RVar1 = Expect(this,Rpar), RVar1.enum_ == Error)) {
      pp_Var3 = pCVar2->_vptr_Command;
      pCVar5 = pCVar2;
    }
    else {
      pCVar5 = (out_command->_M_t).
               super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
               super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
      super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar2;
      EVar4 = Ok;
      if (pCVar5 == (Command *)0x0) {
        return (Result)Ok;
      }
      pp_Var3 = pCVar5->_vptr_Command;
    }
    (*pp_Var3[1])(pCVar5);
    return (Result)EVar4;
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseAssertScriptModuleCommand(TokenType token_type,
                                                  CommandPtr* out_command) {
  WABT_TRACE(ParseAssertScriptModuleCommand);
  EXPECT(Lpar);
  CHECK_RESULT(Expect(token_type));
  auto command = std::make_unique<T>();
  CHECK_RESULT(ParseScriptModule(&command->module));
  CHECK_RESULT(ParseQuotedText(&command->text));
  EXPECT(Rpar);
  *out_command = std::move(command);
  return Result::Ok;
}